

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_channel_id_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  size_t sVar2;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  if (((contents != (CBS *)0x0) && ((*(ushort *)&hs->config->field_0x10d >> 3 & 1) != 0)) &&
     (iVar1 = SSL_is_dtls(hs->ssl), iVar1 == 0)) {
    sVar2 = CBS_len(contents);
    if (sVar2 != 0) {
      return false;
    }
    *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xfeffffff | 0x1000000;
    return true;
  }
  return true;
}

Assistant:

static bool ext_channel_id_parse_clienthello(SSL_HANDSHAKE *hs,
                                             uint8_t *out_alert,
                                             CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL || !hs->config->channel_id_enabled || SSL_is_dtls(ssl)) {
    return true;
  }

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->channel_id_negotiated = true;
  return true;
}